

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_mesh.hpp
# Opt level: O0

int __thiscall
sisl::utility::ply_mesh::add_triangle(ply_mesh *this,vertex3 *v1,vertex3 *v2,vertex3 *v3)

{
  int iVar1;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var2;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var3;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var4;
  size_type sVar5;
  undefined1 local_34 [8];
  tuple<int,_int,_int> f;
  vertex3 *v3_local;
  vertex3 *v2_local;
  vertex3 *v1_local;
  ply_mesh *this_local;
  
  f.super__Tuple_impl<0UL,_int,_int,_int>._4_8_ = v3;
  std::tuple<int,_int,_int>::tuple<void,_true>((tuple<int,_int,_int> *)local_34);
  iVar1 = add_vertex(this,v1);
  p_Var2 = std::get<0ul,int,int,int>((tuple<int,_int,_int> *)local_34);
  *p_Var2 = iVar1;
  iVar1 = add_vertex(this,v2);
  p_Var3 = std::get<1ul,int,int,int>((tuple<int,_int,_int> *)local_34);
  *p_Var3 = iVar1;
  iVar1 = add_vertex(this,v3);
  p_Var4 = std::get<2ul,int,int,int>((tuple<int,_int,_int> *)local_34);
  *p_Var4 = iVar1;
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::push_back
            (&this->faces,(value_type *)local_34);
  sVar5 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::size
                    (&this->faces);
  return (int)sVar5 + -1;
}

Assistant:

int add_triangle(vertex3 v1, vertex3 v2, vertex3 v3) {
            std::tuple<int,int,int> f;

            #pragma omp critical (add_face)
            {
                std::get<0>(f) = add_vertex(v1);
                std::get<1>(f) = add_vertex(v2);
                std::get<2>(f) = add_vertex(v3);

                faces.push_back(f);
            }
            return int(faces.size())-1;
        }